

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_streambuf.cpp
# Opt level: O0

ssize_t __thiscall seekable::read(seekable *this,int __fd,void *__buf,size_t __nbytes)

{
  size_t sVar1;
  ulong uVar2;
  size_type sVar3;
  reference __src;
  undefined4 in_register_00000034;
  void *local_18;
  
  sVar1 = this->pos;
  sVar3 = std::vector<char,_std::allocator<char>_>::size(&this->dev);
  local_18 = __buf;
  if (sVar3 < (long)__buf + sVar1) {
    uVar2 = this->pos;
    sVar3 = std::vector<char,_std::allocator<char>_>::size(&this->dev);
    if (sVar3 < uVar2) {
      local_18 = (void *)0x0;
    }
    else {
      sVar3 = std::vector<char,_std::allocator<char>_>::size(&this->dev);
      local_18 = (void *)(sVar3 - this->pos);
    }
  }
  if (local_18 != (void *)0x0) {
    __src = std::vector<char,_std::allocator<char>_>::operator[](&this->dev,this->pos);
    memcpy((void *)CONCAT44(in_register_00000034,__fd),__src,(size_t)local_18);
  }
  this->pos = (long)local_18 + this->pos;
  return (ssize_t)local_18;
}

Assistant:

size_t read(char *p,size_t n)
	{
		if(n + pos > dev.size()) {
			if(pos > dev.size())
				n=0;
			else
				n=dev.size() - pos;
		}
		if(n>0)
			memcpy(p,&dev[pos],n);
		pos+=n;
		return n;
	}